

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uint uVar1;
  int type;
  size_t sVar2;
  CURLcode CVar3;
  CURLMcode CVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  dynbuf *pdVar8;
  long lVar9;
  ulong uVar10;
  dynbuf *pdVar11;
  tempbuf writebuf [3];
  dynbuf local_a8;
  int local_88 [22];
  
  CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) &&
     (data->conn != (connectdata *)0x0)) {
    uVar1 = (data->req).keepon;
    uVar7 = ((action & 1U) << 4 | uVar1 & 0xffffffcf) + (action & 4U) * 8;
    CVar3 = CURLE_OK;
    if ((uVar7 & 0x30) != (uVar1 & 0x30)) {
      if ((((uVar1 & ~uVar7 & 0x20) != 0) && ((data->mstate & ~MSTATE_PENDING) == MSTATE_PERFORMING)
          ) && ((data->state).fread_func == Curl_mime_read)) {
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar7;
      CVar3 = CURLE_OK;
      if ((action & 1U) == 0) {
        CVar3 = CURLE_OK;
        Curl_http2_stream_pause(data,false);
        uVar1 = (data->state).tempcount;
        if (uVar1 != 0) {
          if ((data->state).tempcount != 0) {
            pdVar11 = &(data->state).tempwrite[0].b;
            pdVar8 = &local_a8;
            uVar10 = 0;
            do {
              pdVar8[1].bufr = pdVar11[1].bufr;
              pcVar5 = pdVar11->bufr;
              sVar6 = pdVar11->leng;
              sVar2 = pdVar11->toobig;
              pdVar8->allc = pdVar11->allc;
              pdVar8->toobig = sVar2;
              pdVar8->bufr = pcVar5;
              pdVar8->leng = sVar6;
              Curl_dyn_init(pdVar11,0x4000000);
              uVar10 = uVar10 + 1;
              pdVar8 = (dynbuf *)&pdVar8[1].leng;
              pdVar11 = (dynbuf *)&pdVar11[1].leng;
            } while (uVar10 < (data->state).tempcount);
          }
          (data->state).tempcount = 0;
          lVar9 = 0;
          CVar3 = CURLE_OK;
          do {
            pdVar11 = (dynbuf *)((long)&local_a8.bufr + lVar9);
            if (CVar3 == CURLE_OK) {
              type = *(int *)((long)local_88 + lVar9);
              pcVar5 = Curl_dyn_ptr(pdVar11);
              sVar6 = Curl_dyn_len(pdVar11);
              CVar3 = Curl_client_write(data,type,pcVar5,sVar6);
            }
            Curl_dyn_free(pdVar11);
            lVar9 = lVar9 + 0x28;
          } while ((ulong)(uVar1 + (uVar1 == 0)) * 0x28 != lVar9);
          if (CVar3 != CURLE_OK) {
            return CVar3;
          }
        }
      }
      if ((uVar7 & 0x30) != 0x30) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        (data->state).keeps_speed.tv_sec = 0;
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if ((data->multi != (Curl_multi *)0x0) &&
           (CVar4 = Curl_update_timer(data->multi), CVar4 != CURLM_OK)) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      if (((data->state).field_0x6d1 & 8) == 0) {
        CVar3 = Curl_updatesocket(data);
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == MSTATE_PERFORMING ||
      data->mstate == MSTATE_RATELIMITING) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(data, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      if(result)
        return result;
    }
  }

#ifdef USE_HYPER
  if(!(newstate & KEEP_SEND_PAUSE)) {
    /* need to wake the send body waker */
    if(data->hyp.send_body_waker) {
      hyper_waker_wake(data->hyp.send_body_waker);
      data->hyp.send_body_waker = NULL;
    }
  }
#endif

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi) {
      if(Curl_update_timer(data->multi))
        return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  return result;
}